

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

string * cs::get_sdk_path_abi_cxx11_(void)

{
  __uid_t __uid;
  char *__s;
  size_t sVar1;
  passwd *ppVar2;
  long *plVar3;
  size_type *psVar4;
  string *in_RDI;
  allocator local_59;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38 [2];
  size_type local_28 [2];
  
  __s = getenv("COVSCRIPT_HOME");
  if (__s == (char *)0x0) {
    __uid = getuid();
    ppVar2 = getpwuid(__uid);
    std::__cxx11::string::string((string *)local_38,ppVar2->pw_dir,&local_59);
    plVar3 = (long *)std::__cxx11::string::append((char *)local_38);
    psVar4 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58.field_2._8_8_ = plVar3[3];
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    }
    else {
      local_58.field_2._M_allocated_capacity = *psVar4;
      local_58._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_58._M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    process_path(in_RDI,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if (local_38[0] ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28) {
      return in_RDI;
    }
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,__s,__s + sVar1);
    process_path(in_RDI,&local_58);
    local_28[0] = local_58.field_2._M_allocated_capacity;
    local_38[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return in_RDI;
    }
  }
  operator_delete(local_38[0],local_28[0] + 1);
  return in_RDI;
}

Assistant:

std::string get_sdk_path()
	{
#ifdef COVSCRIPT_HOME
		return COVSCRIPT_HOME;
#else
		const char *sdk_path = std::getenv("COVSCRIPT_HOME");
		if (sdk_path == nullptr) {
			struct passwd *pw = getpwuid(getuid());
			return process_path(std::string(pw->pw_dir) + "/.covscript");
		}
		else
			return process_path(sdk_path);
#endif
	}